

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O3

RangeValue __thiscall CoreML::RangeValue::operator-(RangeValue *this,RangeValue *other)

{
  undefined8 extraout_RAX;
  undefined8 uVar1;
  size_t sVar2;
  undefined8 extraout_RAX_00;
  runtime_error *this_00;
  RangeValue RVar3;
  stringstream ss;
  string asStack_1d8 [32];
  RangeValue local_1b8;
  RangeValue local_1a8;
  ostream local_198 [376];
  
  if (other->_isUnbound == true) {
    if (this->_isUnbound == false) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_198,"Subtracting unbound range ",0x1a);
      ::operator<<(local_198,other);
      std::__ostream_insert<char,std::char_traits<char>>(local_198," from bound range ",0x12);
      ::operator<<(local_198,this);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,asStack_1d8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    RangeValue(&local_1b8);
    uVar1 = CONCAT71((int7)((ulong)extraout_RAX >> 8),local_1b8._isUnbound);
  }
  else {
    sVar2 = value(other);
    RangeValue(&local_1a8);
    if (this->_isUnbound == true) {
      uVar1 = CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),local_1a8._isUnbound);
      local_1b8._val = local_1a8._val;
    }
    else {
      uVar1 = 0;
      local_1b8._val = 0;
      if (sVar2 <= this->_val) {
        local_1b8._val = this->_val - sVar2;
      }
    }
  }
  RVar3._val = local_1b8._val;
  RVar3._0_8_ = uVar1;
  return RVar3;
}

Assistant:

RangeValue RangeValue::operator- (const RangeValue& other) const {
    if (other.isUnbound() && !(this->isUnbound())) {
        std::stringstream ss;
        ss << "Subtracting unbound range " << other << " from bound range " << *this;
        throw std::runtime_error(ss.str());
    }
    else if (other.isUnbound()) {
        // both unbound
        return RangeValue();
    }
    else {
        return (*this)-other.value();
    }
}